

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiero_console.cpp
# Opt level: O2

int main(void)

{
  pointer pPVar1;
  istream *piVar2;
  ostream *poVar3;
  PhrasalRule *rule;
  pointer rule_00;
  string_view line_00;
  Labeler local_d0;
  _Vector_base<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_> local_c8;
  string line;
  vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> initial;
  AlignedSentencePair asp;
  
  line._M_dataplus._M_p = (pointer)&line.field_2;
  line._M_string_length = 0;
  line.field_2._M_local_buf[0] = '\0';
  local_d0._vptr_Labeler = (_func_int **)&PTR_operator___0010ad50;
  while( true ) {
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)&std::cin,(string *)&line);
    if (((byte)(piVar2 + 0x20)[(long)*(char **)(*(long *)piVar2 + -0x18)] & 5) != 0) break;
    line_00._M_str = *(char **)(*(long *)piVar2 + -0x18);
    line_00._M_len = (size_t)line._M_dataplus._M_p;
    jhu::thrax::readAlignedSentencePair<false,false>(&asp,(thrax *)line._M_string_length,line_00);
    jhu::thrax::minimalConsistentPairs
              ((vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)
               &initial.
                super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>,
               &asp.alignment,10);
    jhu::thrax::extract((vector<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_> *
                        )&local_c8,&local_d0,&asp,
                        (vector<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_> *)
                        &initial.
                         super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>
                       );
    pPVar1 = local_c8._M_impl.super__Vector_impl_data._M_finish;
    for (rule_00 = local_c8._M_impl.super__Vector_impl_data._M_start; rule_00 != pPVar1;
        rule_00 = rule_00 + 1) {
      poVar3 = jhu::thrax::operator<<((ostream *)&std::cout,rule_00);
      std::operator<<(poVar3,'\n');
    }
    std::_Vector_base<jhu::thrax::PhrasalRule,_std::allocator<jhu::thrax::PhrasalRule>_>::
    ~_Vector_base(&local_c8);
    std::_Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>::~_Vector_base
              (&initial.
                super__Vector_base<jhu::thrax::SpanPair,_std::allocator<jhu::thrax::SpanPair>_>);
    jhu::thrax::AlignedSentencePair::~AlignedSentencePair(&asp);
  }
  std::__cxx11::string::~string((string *)&line);
  return 0;
}

Assistant:

int main() {
  std::string line;
  jhu::thrax::HieroLabeler hiero{};
  while (std::getline(std::cin, line)) {
    auto asp = jhu::thrax::readAlignedSentencePair<false, false>(line);
    auto initial = jhu::thrax::minimalConsistentPairs(asp.alignment, 10);
    for (const auto& rule : jhu::thrax::extract(hiero, asp, initial)) {
      std::cout << rule << '\n';
    }
  }
}